

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledBitmap.h
# Opt level: O0

void __thiscall
SSD1306::OledBitmap<16,_16>::OledBitmap(OledBitmap<16,_16> *this,initializer_list<int> list)

{
  value_type vVar1;
  const_iterator piVar2;
  reference pvVar3;
  initializer_list<int> *in_RDI;
  int item;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<int> *__range2;
  int block;
  int byte;
  undefined7 in_stack_ffffffffffffff98;
  initializer_list<int> *this_00;
  size_type *local_48;
  const_iterator local_30;
  int local_1c;
  initializer_list<int> local_10;
  
  OledPixel::OledPixel((OledPixel *)in_RDI);
  in_RDI->_M_array = (iterator)&PTR__OledBitmap_00110a90;
  local_48 = &in_RDI->_M_len;
  this_00 = in_RDI;
  memset(local_48,0,0x20);
  do {
    local_48 = (size_type *)((long)local_48 + 2);
  } while (local_48 != &in_RDI[2]._M_len);
  local_1c = 0;
  local_30 = std::initializer_list<int>::begin(&local_10);
  piVar2 = std::initializer_list<int>::end(this_00);
  for (; local_30 != piVar2; local_30 = local_30 + 1) {
    vVar1 = (value_type)*local_30;
    std::array<std::array<unsigned_char,_2UL>,_16UL>::operator[]
              ((array<std::array<unsigned_char,_2UL>,_16UL> *)this_00,
               CONCAT17(vVar1,in_stack_ffffffffffffff98));
    local_1c = local_1c + 1;
    pvVar3 = std::array<unsigned_char,_2UL>::operator[]
                       ((array<unsigned_char,_2UL> *)this_00,
                        CONCAT17(vVar1,in_stack_ffffffffffffff98));
    *pvVar3 = vVar1;
    if (0xf < local_1c * 8) {
      local_1c = 0;
    }
  }
  return;
}

Assistant:

OledBitmap(std::initializer_list<int> list)
    :
        blocks_{}
    {
        auto byte = 0;
        auto block = 0;

        for (auto item : list)
        {
            blocks_[block][byte++] = item;

            if ((byte * 8) >= Width)
            {
                byte = 0;
                block += 1;
            }
        }
    }